

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall
GlobOpt::IsPrepassSrcValueInfoPrecise
          (GlobOpt *this,Instr *instr,Value *src1Value,Value *src2Value,
          bool *isSafeToTransferInPrepass)

{
  bool bVar1;
  
  if ((instr->m_src1 != (Opnd *)0x0) &&
     (bVar1 = IsPrepassSrcValueInfoPrecise(this,instr->m_src1,src1Value,isSafeToTransferInPrepass),
     !bVar1)) {
    return false;
  }
  if (instr->m_src2 == (Opnd *)0x0) {
    return true;
  }
  bVar1 = IsPrepassSrcValueInfoPrecise(this,instr->m_src2,src2Value,isSafeToTransferInPrepass);
  return bVar1;
}

Assistant:

bool
GlobOpt::IsPrepassSrcValueInfoPrecise(IR::Instr *const instr, Value *const src1Value, Value *const src2Value, bool * isSafeToTransferInPrepass) const
{
    return
        (!instr->GetSrc1() || IsPrepassSrcValueInfoPrecise(instr->GetSrc1(), src1Value, isSafeToTransferInPrepass)) &&
        (!instr->GetSrc2() || IsPrepassSrcValueInfoPrecise(instr->GetSrc2(), src2Value, isSafeToTransferInPrepass));
}